

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::tryExpandData
          (Group *this,uint oldLgSize,uint oldOffset,uint expansionFactor)

{
  DataLocation *location;
  DataLocationUsage *pDVar1;
  DataLocation *pDVar2;
  ulong uVar3;
  bool bVar4;
  char *pcVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  Fault f;
  Fault local_30;
  
  if ((expansionFactor + oldLgSize < 7) &&
     ((~(-1 << ((byte)expansionFactor & 0x1f)) & oldOffset) == 0)) {
    bVar11 = 0;
  }
  else {
    pcVar5 = getenv("CAPNP_IGNORE_ISSUE_344");
    if (pcVar5 != (char *)0x0) {
      return false;
    }
    bVar11 = 1;
  }
  pDVar1 = (this->parentDataLocationUsage).builder.ptr;
  lVar7 = (long)(this->parentDataLocationUsage).builder.pos - (long)pDVar1;
  if (lVar7 != 0) {
    pDVar2 = (this->parent->dataLocations).builder.ptr;
    uVar3 = 1;
    uVar9 = 0;
    do {
      uVar8 = uVar3;
      uVar10 = pDVar2[uVar9].lgSize;
      bVar6 = (char)uVar10 - (char)oldLgSize;
      if (oldLgSize <= uVar10) {
        uVar10 = oldOffset >> (bVar6 & 0x1f);
        location = pDVar2 + uVar9;
        if (uVar10 == location->offset) {
          bVar4 = DataLocationUsage::tryExpand
                            (pDVar1 + uVar9,this,location,oldLgSize,
                             oldOffset - (uVar10 << (bVar6 & 0x1f)),expansionFactor);
          if ((bVar11 & bVar4) != 1) {
            return bVar4;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[180]>
                    (&local_30,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0x22c,FAILED,(char *)0x0,
                     "\"Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/sandstorm-io/capnproto/issues/344\""
                     ,(char (*) [180])
                      "Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/sandstorm-io/capnproto/issues/344"
                    );
          kj::_::Debug::Fault::fatal(&local_30);
        }
      }
      uVar3 = (ulong)((int)uVar8 + 1);
      uVar9 = uVar8;
    } while (uVar8 < (ulong)(lVar7 >> 3));
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x232,FAILED,(char *)0x0,"\"Tried to expand field that was never allocated.\"",
             (char (*) [48])"Tried to expand field that was never allocated.");
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

bool tryExpandData(uint oldLgSize, uint oldOffset, uint expansionFactor) override {
      bool mustFail = false;
      if (oldLgSize + expansionFactor > 6 ||
          (oldOffset & ((1 << expansionFactor) - 1)) != 0) {
        // Expansion is not possible because the new size is too large or the offset is not
        // properly-aligned.

        // Unfortunately, Cap'n Proto 0.5.x and prior forgot to "return false" here, instead
        // continuing to execute the rest of the method. In most cases, the method failed later
        // on, causing no harm. But, in cases where the method later succeeded, it probably
        // led to bogus layouts. We cannot simply add the return statement now as this would
        // silently break backwards-compatibility with affected schemas. Instead, we detect the
        // problem and throw an exception.
        //
        // TODO(cleanup): Once sufficient time has elapsed, switch to "return false;" here.
        if (shouldDetectIssue344()) {
          mustFail = true;
        } else {
          return false;
        }
      }

      for (uint i = 0; i < parentDataLocationUsage.size(); i++) {
        auto& location = parent.dataLocations[i];
        if (location.lgSize >= oldLgSize &&
            oldOffset >> (location.lgSize - oldLgSize) == location.offset) {
          // The location we're trying to expand is a subset of this data location.
          auto& usage = parentDataLocationUsage[i];

          // Adjust the offset to be only within this location.
          uint localOldOffset = oldOffset - (location.offset << (location.lgSize - oldLgSize));

          // Try to expand.
          bool result = usage.tryExpand(
              *this, location, oldLgSize, localOldOffset, expansionFactor);
          if (mustFail && result) {
            KJ_FAIL_ASSERT("Bad news: Cap'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/sandstorm-io/capnproto/issues/344");
          }
          return result;
        }
      }

      KJ_FAIL_ASSERT("Tried to expand field that was never allocated.");
      return false;
    }